

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O3

void xm_generate_samples(xm_context_t *ctx,float *output,size_t numsamples)

{
  long lVar1;
  uint8_t uVar2;
  xm_channel_context_t *pxVar3;
  xm_instrument_t *pxVar4;
  undefined1 auVar5 [16];
  byte bVar6;
  bool bVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  xm_pattern_slot_t *pxVar11;
  ulong uVar12;
  xm_channel_context_t *pxVar13;
  byte bVar14;
  xm_pattern_t *pxVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  undefined8 uVar19;
  float fVar20;
  float fVar21;
  float local_54;
  size_t local_50;
  
  ctx->generated_samples = ctx->generated_samples + numsamples;
  if (numsamples != 0) {
    local_50 = 0;
    do {
      fVar18 = ctx->remaining_samples_in_tick;
      if (fVar18 <= 0.0) {
        if (ctx->current_tick == 0) {
          if (ctx->position_jump == true) {
            bVar14 = ctx->jump_dest;
            uVar12 = (ulong)bVar14;
            ctx->current_table_index = bVar14;
            ctx->current_row = ctx->jump_row;
            ctx->position_jump = false;
            ctx->pattern_break = false;
            ctx->jump_row = '\0';
            if ((ctx->module).length <= (ushort)bVar14) {
LAB_00104296:
              bVar14 = (byte)(ctx->module).restart_position;
              uVar12 = (ulong)bVar14;
              ctx->current_table_index = bVar14;
            }
          }
          else {
            uVar12 = (ulong)ctx->current_table_index;
            if (ctx->pattern_break == true) {
              bVar14 = ctx->current_table_index + 1;
              uVar12 = (ulong)bVar14;
              ctx->current_table_index = bVar14;
              ctx->current_row = ctx->jump_row;
              ctx->pattern_break = false;
              ctx->jump_row = '\0';
              if ((ctx->module).length <= (ushort)bVar14) goto LAB_00104296;
            }
          }
          uVar9 = (uint)uVar12;
          bVar14 = (ctx->module).pattern_table[uVar12];
          if ((ushort)bVar14 < (ctx->module).num_patterns) {
            pxVar15 = (ctx->module).patterns + bVar14;
          }
          else {
            pxVar15 = (xm_pattern_t *)0x0;
          }
          uVar8 = (ctx->module).num_channels;
          if (uVar8 == 0) {
LAB_00104382:
            uVar12 = (ulong)ctx->current_row | (ulong)(uVar9 << 8);
            uVar2 = ctx->row_loop_count[uVar12];
            ctx->row_loop_count[uVar12] = uVar2 + '\x01';
            ctx->loop_count = uVar2;
          }
          else {
            bVar7 = false;
            bVar14 = 0;
            do {
              if (pxVar15 == (xm_pattern_t *)0x0) {
                pxVar11 = (xm_pattern_slot_t *)&xm_row_empty_slot;
              }
              else {
                pxVar11 = pxVar15->slots + (ulong)ctx->current_row * (ulong)uVar8 + (ulong)bVar14;
              }
              pxVar13 = ctx->channels + bVar14;
              ctx->channels[bVar14].current = pxVar11;
              if ((pxVar11->effect_type == '\x0e') && ((pxVar11->effect_param & 0xf0) == 0xd0)) {
                pxVar13->note_delay_param = pxVar11->effect_param & 0xf;
              }
              else {
                xm_handle_note_and_instrument(ctx,pxVar13,pxVar11);
              }
              if ((!bVar7) && (pxVar13->pattern_loop_count != '\0')) {
                bVar7 = true;
              }
              bVar14 = bVar14 + 1;
              uVar8 = (ctx->module).num_channels;
            } while (bVar14 < uVar8);
            if (!bVar7) {
              uVar9 = (uint)ctx->current_table_index;
              goto LAB_00104382;
            }
          }
          bVar14 = ctx->current_row + 1;
          ctx->current_row = bVar14;
          if ((ctx->position_jump == false) && (ctx->pattern_break == false)) {
            if (pxVar15 == (xm_pattern_t *)0x0) {
              uVar8 = 0x40;
            }
            else {
              uVar8 = pxVar15->num_rows;
            }
            if ((bVar14 == 0) || (uVar8 <= bVar14)) {
              bVar14 = ctx->current_table_index + 1;
              ctx->current_table_index = bVar14;
              ctx->current_row = ctx->jump_row;
              ctx->jump_row = '\0';
              if ((ctx->module).length <= (ushort)bVar14) {
                ctx->current_table_index = (uint8_t)(ctx->module).restart_position;
              }
            }
          }
        }
        if ((ctx->module).num_channels != 0) {
          uVar9 = 1;
          do {
            pxVar3 = ctx->channels;
            uVar10 = uVar9 - 1 & 0xff;
            pxVar13 = pxVar3 + uVar10;
            xm_envelopes(pxVar13);
            pxVar4 = pxVar3[uVar10].instrument;
            if ((pxVar4 == (xm_instrument_t *)0x0) || (pxVar4->vibrato_depth == '\0')) {
              if ((pxVar13->autovibrato_note_offset != 0.0) ||
                 (NAN(pxVar13->autovibrato_note_offset))) {
                pxVar13->autovibrato_note_offset = 0.0;
                goto LAB_00104516;
              }
            }
            else {
              uVar8 = pxVar13->autovibrato_ticks;
              if (uVar8 < pxVar4->vibrato_sweep) {
                local_54 = (float)uVar8 / (float)(ushort)pxVar4->vibrato_sweep;
              }
              else {
                local_54 = 1.0;
              }
              pxVar13->autovibrato_ticks = uVar8 + 1;
              fVar18 = xm_waveform(pxVar4->vibrato_type,
                                   (uint8_t)((uint)pxVar4->vibrato_rate * (uint)uVar8 >> 2));
              pxVar13->autovibrato_note_offset =
                   (((float)pxVar4->vibrato_depth * fVar18 * 0.25) / 15.0) * local_54;
LAB_00104516:
              xm_update_frequency(ctx,pxVar13);
            }
            if ((pxVar13->arp_in_progress == true) &&
               ((pxVar13->current->effect_type != '\0' || (pxVar13->current->effect_param == '\0')))
               ) {
              pxVar13->arp_in_progress = false;
              pxVar13->arp_note_offset = '\0';
              xm_update_frequency(ctx,pxVar13);
            }
            if (((pxVar13->vibrato_in_progress == true) &&
                ((pxVar13->current->effect_type | 2) != 6)) &&
               ((pxVar13->current->volume_column & 0xf0) != 0xb0)) {
              pxVar13->vibrato_in_progress = false;
              pxVar13->vibrato_note_offset = 0.0;
              xm_update_frequency(ctx,pxVar13);
            }
            bVar14 = pxVar13->current->volume_column;
            switch(bVar14 >> 4) {
            case 6:
              if (ctx->current_tick != 0) {
                bVar14 = bVar14 & 0xf;
LAB_00104614:
                xm_volume_slide(pxVar13,bVar14);
              }
              break;
            case 7:
              if (ctx->current_tick != 0) {
                bVar14 = bVar14 << 4;
                goto LAB_00104614;
              }
              break;
            case 0xb:
              if (ctx->current_tick != 0) {
                pxVar13->vibrato_in_progress = false;
                xm_vibrato(ctx,pxVar13,pxVar13->vibrato_param);
              }
              break;
            case 0xd:
              if (ctx->current_tick != 0) {
                bVar14 = bVar14 & 0xf;
LAB_0010463e:
                xm_panning_slide(pxVar13,bVar14);
              }
              break;
            case 0xe:
              if (ctx->current_tick != 0) {
                bVar14 = bVar14 << 4;
                goto LAB_0010463e;
              }
              break;
            case 0xf:
              if (ctx->current_tick != 0) {
                xm_tone_portamento(ctx,pxVar13);
              }
            }
            pxVar11 = pxVar13->current;
            switch(pxVar11->effect_type) {
            case '\0':
              bVar14 = pxVar11->effect_param;
              if (bVar14 != 0) {
                uVar10 = (uint)ctx->tempo % 3;
                if ((short)uVar10 == 2) {
                  uVar8 = ctx->current_tick;
                  if (uVar8 != 1) goto LAB_00104a89;
LAB_00104ad3:
                  pxVar13->arp_in_progress = true;
                  bVar14 = bVar14 >> 4;
                }
                else {
                  if (uVar10 == 1) {
                    uVar8 = ctx->current_tick;
LAB_00104a89:
                    if (uVar8 == 0) {
                      pxVar13->arp_in_progress = false;
                      pxVar13->arp_note_offset = '\0';
                      goto LAB_00104b20;
                    }
                  }
                  else {
                    uVar8 = ctx->current_tick;
                  }
                  uVar10 = (uVar8 - uVar10) + ((uVar8 - uVar10 & 0xffff) / 3) * -3;
                  if ((short)uVar10 == 2) goto LAB_00104ad3;
                  if ((uVar10 & 0xffff) == 1) {
                    pxVar13->arp_in_progress = true;
                    bVar14 = bVar14 & 0xf;
                  }
                  else {
                    pxVar13->arp_in_progress = false;
                    bVar14 = 0;
                  }
                }
                pxVar13->arp_note_offset = bVar14;
LAB_00104b20:
                xm_update_frequency(ctx,pxVar13);
              }
              break;
            case '\x01':
              if (ctx->current_tick != 0) {
                uVar10 = -(uint)pxVar13->portamento_up_param;
LAB_00104860:
                fVar18 = (float)(int)uVar10 * 4.0;
                if ((ctx->module).frequency_type != XM_LINEAR_FREQUENCIES) {
                  fVar18 = (float)(int)uVar10;
                }
                fVar18 = fVar18 + pxVar13->period;
                fVar20 = 0.0;
                if (0.0 <= fVar18) {
                  fVar20 = fVar18;
                }
                pxVar13->period = fVar20;
                goto LAB_00104b20;
              }
              break;
            case '\x02':
              if (ctx->current_tick != 0) {
                uVar10 = (uint)pxVar13->portamento_down_param;
                goto LAB_00104860;
              }
              break;
            case '\x03':
              if (ctx->current_tick != 0) {
                xm_tone_portamento(ctx,pxVar13);
              }
              break;
            case '\x04':
              if (ctx->current_tick != 0) {
                pxVar13->vibrato_in_progress = true;
                xm_vibrato(ctx,pxVar13,pxVar13->vibrato_param);
              }
              break;
            case '\x05':
              if (ctx->current_tick != 0) {
                xm_tone_portamento(ctx,pxVar13);
LAB_00104a1b:
                xm_volume_slide(pxVar13,pxVar13->volume_slide_param);
              }
              break;
            case '\x06':
              if (ctx->current_tick != 0) {
                pxVar13->vibrato_in_progress = true;
                xm_vibrato(ctx,pxVar13,pxVar13->vibrato_param);
                goto LAB_00104a1b;
              }
              break;
            case '\a':
              if (ctx->current_tick != 0) {
                bVar14 = pxVar13->tremolo_param;
                uVar2 = pxVar13->tremolo_ticks;
                pxVar13->tremolo_ticks = uVar2 + '\x01';
                fVar18 = xm_waveform(pxVar13->tremolo_waveform,(bVar14 >> 4) * uVar2);
                pxVar13->tremolo_volume = ((float)(bVar14 & 0xf) * fVar18) / -15.0;
              }
              break;
            case '\n':
              if (ctx->current_tick != 0) goto LAB_00104a1b;
              break;
            case '\x0e':
              bVar14 = pxVar11->effect_param;
              bVar6 = bVar14 >> 4;
              if (bVar6 == 0xd) {
                if (ctx->current_tick == (ushort)pxVar13->note_delay_param) {
                  xm_handle_note_and_instrument(ctx,pxVar13,pxVar11);
LAB_00104a6e:
                  xm_envelopes(pxVar13);
                }
              }
              else if (bVar6 == 0xc) {
                if ((bVar14 & 0xf) == ctx->current_tick) goto LAB_00104a41;
              }
              else if ((((bVar6 == 9) && (ctx->current_tick != 0)) && ((bVar14 & 0xf) != 0)) &&
                      ((short)((uint)ctx->current_tick % (bVar14 & 0xf)) == 0)) {
                xm_trigger_note(ctx,pxVar13,1);
                goto LAB_00104a6e;
              }
              break;
            case '\x11':
              if ((ctx->current_tick != 0) &&
                 (bVar14 = pxVar13->global_volume_slide_param, bVar14 < 0x10 || (bVar14 & 0xf) == 0)
                 ) {
                if (bVar14 < 0x10) {
                  fVar20 = (float)(int)(char)bVar14 * -0.015625 + ctx->global_volume;
                  fVar18 = 0.0;
                  if (0.0 <= fVar20) {
                    fVar18 = fVar20;
                  }
                }
                else {
                  fVar20 = (float)(bVar14 >> 4) * 0.015625 + ctx->global_volume;
                  fVar18 = 1.0;
                  if (fVar20 <= 1.0) {
                    fVar18 = fVar20;
                  }
                }
                ctx->global_volume = fVar18;
              }
              break;
            case '\x14':
              if (ctx->current_tick == (ushort)pxVar11->effect_param) {
                pxVar13->sustained = false;
                if ((pxVar13->instrument == (xm_instrument_t *)0x0) ||
                   ((pxVar13->instrument->volume_envelope).enabled == false)) {
LAB_00104a41:
                  pxVar13->volume = 0.0;
                }
              }
              break;
            case '\x19':
              if (ctx->current_tick != 0) {
                xm_panning_slide(pxVar13,pxVar13->panning_slide_param);
              }
              break;
            case '\x1b':
              if (((ctx->current_tick != 0) && ((pxVar13->multi_retrig_param & 0xf) != 0)) &&
                 (((short)((uint)ctx->current_tick % (pxVar13->multi_retrig_param & 0xf)) == 0 &&
                  ((xm_trigger_note(ctx,pxVar13,9), pxVar13->current->volume_column == '\0' &&
                   ((pxVar13->instrument->volume_envelope).enabled == false)))))) {
                bVar14 = pxVar13->multi_retrig_param >> 4;
                fVar20 = pxVar13->volume * multi_retrig_multiply[bVar14] +
                         multi_retrig_add[bVar14] * 0.015625;
                fVar18 = 1.0;
                if ((fVar20 <= 1.0) && (fVar18 = fVar20, fVar20 < 0.0)) {
                  fVar18 = 0.0;
                }
                pxVar13->volume = fVar18;
              }
              break;
            case '\x1d':
              if (ctx->current_tick != 0) {
                uVar10 = (uint)(pxVar13->tremor_param >> 4);
                pxVar13->tremor_on =
                     uVar10 < (ctx->current_tick - 1 & 0xffff) %
                              ((pxVar13->tremor_param & 0xf) + uVar10 + 2);
              }
            }
            fVar18 = 0.0;
            if (pxVar13->tremor_on == false) {
              fVar20 = pxVar13->volume + pxVar13->tremolo_volume;
              fVar18 = 1.0;
              if ((fVar20 <= 1.0) && (fVar18 = fVar20, fVar20 < 0.0)) {
                fVar18 = 0.0;
              }
              fVar18 = pxVar13->fadeout_volume * pxVar13->volume_envelope_volume * fVar18;
            }
            fVar20 = (pxVar13->panning_envelope_panning + -0.5) *
                     (0.5 - ABS(pxVar13->panning + -0.5));
            fVar21 = fVar20 + fVar20 + pxVar13->panning;
            fVar20 = 1.0 - fVar21;
            if (fVar20 < 0.0) {
              fVar20 = sqrtf(fVar20);
            }
            else {
              fVar20 = SQRT(fVar20);
            }
            pxVar13->target_volume[0] = fVar20 * fVar18;
            if (fVar21 < 0.0) {
              fVar21 = sqrtf(fVar21);
            }
            else {
              fVar21 = SQRT(fVar21);
            }
            pxVar13->target_volume[1] = fVar18 * fVar21;
            uVar8 = (ushort)uVar9;
            uVar9 = (uint)(byte)((char)uVar9 + 1);
          } while (uVar8 < (ctx->module).num_channels);
        }
        uVar8 = ctx->current_tick + 1;
        ctx->current_tick = uVar8;
        if ((uint)ctx->extra_ticks + (uint)ctx->tempo <= (uint)uVar8) {
          ctx->current_tick = 0;
          ctx->extra_ticks = 0;
        }
        fVar18 = (float)ctx->rate / ((float)ctx->bpm * 0.4) + ctx->remaining_samples_in_tick;
      }
      ctx->remaining_samples_in_tick = fVar18 + -1.0;
      (output + local_50 * 2)[0] = 0.0;
      (output + local_50 * 2)[1] = 0.0;
      bVar14 = ctx->max_loop_count;
      uVar9 = (uint)CONCAT71((int7)(local_50 >> 8),bVar14);
      if ((bVar14 == 0) || (ctx->loop_count < bVar14)) {
        if ((ctx->module).num_channels == 0) {
          uVar19 = 0;
        }
        else {
          lVar1 = local_50 * 2 + 1;
          uVar10 = 1;
          do {
            uVar9 = uVar10;
            uVar10 = uVar9 - 1 & 0xff;
            if (((ctx->channels[uVar10].instrument != (xm_instrument_t *)0x0) &&
                (pxVar13 = ctx->channels + uVar10, pxVar13->sample != (xm_sample_t *)0x0)) &&
               (0.0 < pxVar13->sample_position || pxVar13->sample_position == 0.0)) {
              fVar18 = xm_next_of_sample(pxVar13);
              if ((pxVar13->muted == false) && (pxVar13->instrument->muted == false)) {
                output[local_50 * 2] = pxVar13->actual_volume[0] * fVar18 + output[local_50 * 2];
                output[lVar1] = fVar18 * pxVar13->actual_volume[1] + output[lVar1];
              }
              pxVar13->frame_count = pxVar13->frame_count + 1;
              fVar18 = pxVar13->target_volume[0];
              fVar20 = pxVar13->actual_volume[0];
              if (fVar20 <= fVar18) {
                if ((fVar20 < fVar18) &&
                   (fVar20 = fVar20 + ctx->volume_ramp, pxVar13->actual_volume[0] = fVar20,
                   fVar18 < fVar20)) goto LAB_00104df3;
              }
              else {
                fVar20 = fVar20 - ctx->volume_ramp;
                pxVar13->actual_volume[0] = fVar20;
                if (fVar20 < fVar18) {
LAB_00104df3:
                  pxVar13->actual_volume[0] = fVar18;
                }
              }
              fVar18 = pxVar13->target_volume[1];
              fVar20 = pxVar13->actual_volume[1];
              if (fVar20 <= fVar18) {
                if ((fVar20 < fVar18) &&
                   (fVar20 = fVar20 + ctx->volume_ramp, pxVar13->actual_volume[1] = fVar20,
                   fVar18 < fVar20)) goto LAB_00104e4d;
              }
              else {
                fVar20 = fVar20 - ctx->volume_ramp;
                pxVar13->actual_volume[1] = fVar20;
                if (fVar20 < fVar18) {
LAB_00104e4d:
                  pxVar13->actual_volume[1] = fVar18;
                }
              }
            }
            uVar10 = (uint)(byte)((char)uVar9 + 1);
          } while ((ushort)uVar9 < (ctx->module).num_channels);
          uVar19 = *(undefined8 *)(output + local_50 * 2);
        }
        fVar18 = ctx->global_volume * ctx->amplification;
        fVar20 = fVar18 * (float)uVar19;
        fVar18 = fVar18 * (float)((ulong)uVar19 >> 0x20);
        *(ulong *)(output + local_50 * 2) = CONCAT44(fVar18,fVar20);
        iVar16 = -(uint)(1.0 < ABS(fVar20));
        iVar17 = -(uint)(1.0 < ABS(fVar18));
        auVar5._4_4_ = iVar16;
        auVar5._0_4_ = iVar16;
        auVar5._8_4_ = iVar17;
        auVar5._12_4_ = iVar17;
        iVar16 = movmskpd(uVar9,auVar5);
        if (iVar16 != 0) {
          xm_generate_samples_cold_1();
        }
      }
      local_50 = local_50 + 1;
    } while (local_50 != numsamples);
  }
  return;
}

Assistant:

void xm_generate_samples(xm_context_t* ctx, float* output, size_t numsamples) {
	ctx->generated_samples += numsamples;

	for(size_t i = 0; i < numsamples; i++) {
		xm_sample(ctx, output + (2 * i), output + (2 * i + 1));
	}
}